

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_f89de::CreateMemberAccess
                    (VmModule *module,SynBase *source,VmValue *ptr,VmValue *shift,
                    TypeBase *structType,InplaceStr name)

{
  VmInstruction *pVVar1;
  VmType type;
  VmType VVar2;
  VmValue *in_stack_ffffffffffffffd0;
  
  if ((ptr->type).type != VM_TYPE_POINTER) {
    __assert_fail("ptr->type.type == VM_TYPE_POINTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x220,
                  "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
                 );
  }
  if (((shift->type).type == VM_TYPE_INT) && ((shift->type).size == 4)) {
    VVar2 = VmType::Pointer(structType);
    type.structType = (TypeBase *)0x22;
    type._0_8_ = VVar2.structType;
    pVVar1 = CreateInstruction((anon_unknown_dwarf_f89de *)module,(VmModule *)source,VVar2._0_8_,
                               type,(VmInstructionType)ptr,shift,in_stack_ffffffffffffffd0);
    (pVVar1->super_VmValue).comment.begin = name.begin;
    (pVVar1->super_VmValue).comment.end = name.end;
    return &pVVar1->super_VmValue;
  }
  __assert_fail("shift->type == VmType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x221,
                "VmValue *(anonymous namespace)::CreateMemberAccess(VmModule *, SynBase *, VmValue *, VmValue *, TypeBase *, InplaceStr)"
               );
}

Assistant:

VmValue* CreateMemberAccess(VmModule *module, SynBase *source, VmValue *ptr, VmValue *shift, TypeBase *structType, InplaceStr name)
	{
		assert(ptr->type.type == VM_TYPE_POINTER);
		assert(shift->type == VmType::Int);

		VmInstruction *inst = CreateInstruction(module, source, VmType::Pointer(structType), VM_INST_ADD, ptr, shift);

		inst->comment = name;

		return inst;
	}